

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O3

bool __thiscall
pybind11::detail::argument_loader<ImGuiIO*,char_const*>::load_impl_sequence<0ul,1ul>
          (argument_loader<ImGuiIO*,char_const*> *this,long call)

{
  handle src;
  bool bVar1;
  
  bVar1 = type_caster_generic::load_impl<pybind11::detail::type_caster_generic>
                    ((type_caster_generic *)(this + 0x28),(PyObject *)**(undefined8 **)(call + 8),
                     (bool)((byte)**(undefined4 **)(call + 0x20) & 1));
  if ((bVar1) && (src.m_ptr = *(PyObject **)(*(long *)(call + 8) + 8), src.m_ptr != (PyObject *)0x0)
     ) {
    if (src.m_ptr != (PyObject *)&_Py_NoneStruct) {
      bVar1 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
              ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                      *)this,src,SUB41(((uint)**(ulong **)(call + 0x20) & 2) >> 1,0));
      return bVar1;
    }
    if ((**(ulong **)(call + 0x20) & 2) != 0) {
      this[0x20] = (argument_loader<ImGuiIO*,char_const*>)0x1;
      return true;
    }
  }
  return false;
}

Assistant:

bool load_impl_sequence(function_call &call, index_sequence<Is...>) {
#ifdef __cpp_fold_expressions
        if ((... || !std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])))
            return false;
#else
        for (bool r : {std::get<Is>(argcasters).load(call.args[Is], call.args_convert[Is])...})
            if (!r)
                return false;
#endif
        return true;
    }